

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O1

box3f * __thiscall pbrt::QuadMesh::getBounds(box3f *__return_storage_ptr__,QuadMesh *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar9;
  undefined4 uVar10;
  ulong uVar8;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  pointer pvVar16;
  pointer pvVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined8 uVar20;
  uint uVar21;
  undefined8 *in_RCX;
  pointer pvVar22;
  pointer pvVar23;
  QuadMesh *pQVar24;
  box3f *pbVar25;
  float fVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  float fVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar36;
  float fVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  
  if (this->haveComputedBounds == false) {
    pQVar24 = this;
    uVar21 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
    if (uVar21 != 0) {
      pbVar25 = (box3f *)(ulong)uVar21;
      std::__throw_system_error(uVar21);
      (pbVar25->lower).x = 3.4028235e+38;
      (pbVar25->lower).y = 3.4028235e+38;
      *(undefined8 *)&(pbVar25->lower).z = 0xff7fffff7f7fffff;
      (pbVar25->upper).y = -3.4028235e+38;
      (pbVar25->upper).z = -3.4028235e+38;
      pvVar23 = (pQVar24->index).
                super__Vector_base<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>._M_impl.
                super__Vector_impl_data._M_finish;
      pvVar17 = (pQVar24->index).
                super__Vector_base<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
      fVar37 = (pbVar25->lower).z;
      if (pvVar23 == pvVar17) {
        fVar29 = -3.4028235e+38;
      }
      else {
        uVar3 = (pbVar25->lower).x;
        uVar11 = (pbVar25->lower).y;
        auVar33._4_4_ = uVar11;
        auVar33._0_4_ = uVar3;
        auVar33._8_8_ = 0;
        uVar4 = (pbVar25->upper).x;
        uVar12 = (pbVar25->upper).y;
        auVar35._4_4_ = uVar12;
        auVar35._0_4_ = uVar4;
        auVar35._8_8_ = 0;
        fVar26 = -3.4028235e+38;
        fVar36 = fVar37;
        do {
          fVar37 = (float)pvVar23->x;
          uVar5 = pvVar23->y;
          uVar13 = pvVar23->z;
          fVar29 = (float)uVar13 * *(float *)(in_RCX + 4) +
                   fVar37 * *(float *)(in_RCX + 1) + (float)uVar5 * *(float *)((long)in_RCX + 0x14)
                   + *(float *)((long)in_RCX + 0x2c);
          auVar38._0_8_ =
               CONCAT44((float)uVar13 * (float)((ulong)in_RCX[3] >> 0x20) +
                        (float)uVar5 * (float)((ulong)*(undefined8 *)((long)in_RCX + 0xc) >> 0x20) +
                        fVar37 * (float)((ulong)*in_RCX >> 0x20) +
                        (float)((ulong)*(undefined8 *)((long)in_RCX + 0x24) >> 0x20),
                        (float)uVar13 * (float)in_RCX[3] +
                        (float)uVar5 * (float)*(undefined8 *)((long)in_RCX + 0xc) +
                        fVar37 * (float)*in_RCX + (float)*(undefined8 *)((long)in_RCX + 0x24));
          auVar38._8_4_ = (float)uVar13 * 0.0 + (float)uVar5 * 0.0 + fVar37 * 0.0 + 0.0;
          auVar38._12_4_ = (float)uVar13 * 0.0 + (float)uVar5 * 0.0 + fVar37 * 0.0 + 0.0;
          auVar39._8_4_ = auVar38._8_4_;
          auVar39._0_8_ = auVar38._0_8_;
          auVar39._12_4_ = auVar38._12_4_;
          auVar33 = minps(auVar39,auVar33);
          fVar37 = fVar29;
          if (fVar36 <= fVar29) {
            fVar37 = fVar36;
          }
          auVar35 = maxps(auVar38,auVar35);
          if (fVar29 <= fVar26) {
            fVar29 = fVar26;
          }
          pvVar23 = (pointer)&pvVar23->w;
          fVar26 = fVar29;
          fVar36 = fVar37;
        } while (pvVar23 != pvVar17);
        (pbVar25->lower).x = (float)(int)auVar33._0_8_;
        (pbVar25->lower).y = (float)(int)((ulong)auVar33._0_8_ >> 0x20);
        (pbVar25->upper).x = (float)(int)auVar35._0_8_;
        (pbVar25->upper).y = (float)(int)((ulong)auVar35._0_8_ >> 0x20);
      }
      (pbVar25->lower).z = fVar37;
      (pbVar25->upper).z = fVar29;
      fVar26 = *(float *)((long)&(pQVar24->mutex).super___mutex_base._M_mutex + 0xc);
      fVar36 = *(float *)((long)&(pQVar24->mutex).super___mutex_base._M_mutex + 8);
      if (fVar26 <= fVar36) {
        fVar26 = fVar36;
      }
      uVar6 = (pbVar25->lower).x;
      uVar14 = (pbVar25->lower).y;
      uVar7 = (pbVar25->upper).x;
      uVar15 = (pbVar25->upper).y;
      (pbVar25->lower).x = (float)uVar6 - fVar26;
      (pbVar25->lower).y = (float)uVar14 - fVar26;
      (pbVar25->lower).z = fVar37 - fVar26;
      (pbVar25->upper).x = (float)uVar7 + fVar26;
      (pbVar25->upper).y = (float)uVar15 + fVar26;
      (pbVar25->upper).z = fVar26 + fVar29;
      return pbVar25;
    }
    if (this->haveComputedBounds == false) {
      (this->bounds).lower.x = 3.4028235e+38;
      (this->bounds).lower.y = 3.4028235e+38;
      *(undefined8 *)&(this->bounds).lower.z = 0xff7fffff7f7fffff;
      (this->bounds).upper.y = -3.4028235e+38;
      (this->bounds).upper.z = -3.4028235e+38;
      pvVar22 = (this->vertex).
                super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>._M_impl.
                super__Vector_impl_data._M_start;
      pvVar16 = (this->vertex).
                super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (pvVar22 != pvVar16) {
        uVar1 = (this->bounds).lower.x;
        uVar9 = (this->bounds).lower.y;
        uVar30 = 0;
        uVar31 = 0;
        uVar2 = (this->bounds).upper.x;
        uVar10 = (this->bounds).upper.y;
        uVar27 = 0;
        uVar28 = 0;
        fVar29 = -3.4028235e+38;
        fVar37 = (this->bounds).lower.z;
        do {
          fVar26 = pvVar22->z;
          uVar8._0_4_ = pvVar22->x;
          uVar8._4_4_ = pvVar22->y;
          auVar32._8_8_ = 0;
          auVar32._0_8_ = uVar8;
          auVar34._8_8_ = 0;
          auVar34._0_8_ = uVar8;
          auVar19._4_4_ = uVar9;
          auVar19._0_4_ = uVar1;
          auVar19._8_4_ = uVar30;
          auVar19._12_4_ = uVar31;
          auVar35 = minps(auVar34,auVar19);
          fVar36 = fVar26;
          if (fVar37 <= fVar26) {
            fVar36 = fVar37;
          }
          (this->bounds).lower.x = (float)(int)auVar35._0_8_;
          (this->bounds).lower.y = (float)(int)((ulong)auVar35._0_8_ >> 0x20);
          (this->bounds).lower.z = fVar36;
          auVar18._4_4_ = uVar10;
          auVar18._0_4_ = uVar2;
          auVar18._8_4_ = uVar27;
          auVar18._12_4_ = uVar28;
          auVar33 = maxps(auVar32,auVar18);
          if (fVar26 <= fVar29) {
            fVar26 = fVar29;
          }
          fVar29 = fVar26;
          (this->bounds).upper.x = (float)(int)auVar33._0_8_;
          (this->bounds).upper.y = (float)(int)((ulong)auVar33._0_8_ >> 0x20);
          (this->bounds).upper.z = fVar29;
          pvVar22 = pvVar22 + 1;
          uVar2 = auVar33._0_4_;
          uVar10 = auVar33._4_4_;
          uVar27 = auVar33._8_4_;
          uVar28 = auVar33._12_4_;
          uVar1 = auVar35._0_4_;
          uVar9 = auVar35._4_4_;
          uVar30 = auVar35._8_4_;
          uVar31 = auVar35._12_4_;
          fVar37 = fVar36;
        } while (pvVar22 != pvVar16);
      }
      this->haveComputedBounds = true;
    }
    fVar37 = (this->bounds).upper.z;
    (__return_storage_ptr__->upper).y = (this->bounds).upper.y;
    (__return_storage_ptr__->upper).z = fVar37;
    fVar37 = (this->bounds).lower.y;
    uVar20 = *(undefined8 *)&(this->bounds).lower.z;
    (__return_storage_ptr__->lower).x = (this->bounds).lower.x;
    (__return_storage_ptr__->lower).y = fVar37;
    *(undefined8 *)&(__return_storage_ptr__->lower).z = uVar20;
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  }
  else {
    fVar37 = (this->bounds).upper.z;
    (__return_storage_ptr__->upper).y = (this->bounds).upper.y;
    (__return_storage_ptr__->upper).z = fVar37;
    fVar37 = (this->bounds).lower.y;
    uVar20 = *(undefined8 *)&(this->bounds).lower.z;
    (__return_storage_ptr__->lower).x = (this->bounds).lower.x;
    (__return_storage_ptr__->lower).y = fVar37;
    *(undefined8 *)&(__return_storage_ptr__->lower).z = uVar20;
  }
  return __return_storage_ptr__;
}

Assistant:

box3f QuadMesh::getBounds() 
  {
    if (!haveComputedBounds) {
      std::lock_guard<std::mutex> lock(mutex);
      if (haveComputedBounds) return bounds;
      bounds = box3f::empty_box();
      for (auto v : vertex) bounds.extend(v);
      haveComputedBounds = true;
      return bounds;
    }
    return bounds;
  }